

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-inventory.c
# Opt level: O3

wchar_t borg_wield_slot(borg_item *item)

{
  switch(item->tval) {
  case '\x05':
    return (uint)z_info->pack_size + L'\x01';
  case '\x06':
  case '\a':
  case '\b':
  case '\t':
    return (wchar_t)z_info->pack_size;
  case '\n':
    return (uint)z_info->pack_size + L'\v';
  case '\v':
    return (uint)z_info->pack_size + L'\n';
  case '\f':
  case '\r':
    return (uint)z_info->pack_size + L'\t';
  case '\x0e':
    return (uint)z_info->pack_size + L'\b';
  case '\x0f':
    return (uint)z_info->pack_size + L'\a';
  case '\x10':
  case '\x11':
  case '\x12':
    return (uint)z_info->pack_size + L'\x06';
  case '\x13':
    return (uint)z_info->pack_size + L'\x05';
  case '\x14':
    return (uint)z_info->pack_size + L'\x04';
  case '\x15':
    return (uint)z_info->pack_size + L'\x03';
  default:
    return L'\xffffffff';
  }
}

Assistant:

int borg_wield_slot(const borg_item *item)
{
    switch (item->tval) {
    case TV_SWORD:
    case TV_POLEARM:
    case TV_HAFTED:
    case TV_DIGGING:
        return INVEN_WIELD;

    case TV_DRAG_ARMOR:
    case TV_HARD_ARMOR:
    case TV_SOFT_ARMOR:
        return INVEN_BODY;

    case TV_SHIELD:
        return INVEN_ARM;

    case TV_CROWN:
    case TV_HELM:
        return INVEN_HEAD;

    case TV_BOW:
        return INVEN_BOW;
    case TV_RING:
        return INVEN_LEFT;
    case TV_AMULET:
        return INVEN_NECK;
    case TV_LIGHT:
        return INVEN_LIGHT;
    case TV_CLOAK:
        return INVEN_OUTER;
    case TV_GLOVES:
        return INVEN_HANDS;
    case TV_BOOTS:
        return INVEN_FEET;
    }

    /* No slot available */
    return -1;
}